

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
           *kernel)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Index inner_1;
  Index row;
  long lVar4;
  long lVar5;
  Index col;
  long col_00;
  
  lVar1 = (kernel->m_dstExpr->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
          m_storage.m_rows;
  lVar2 = (kernel->m_dstExpr->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
          m_storage.m_cols;
  col_00 = 0;
  if (lVar2 < 1) {
    lVar2 = col_00;
  }
  lVar3 = 0;
  for (; col_00 != lVar2; col_00 = col_00 + 1) {
    lVar5 = 0;
    if (0 < lVar3) {
      lVar5 = lVar3;
    }
    for (lVar4 = 0; lVar5 != lVar4; lVar4 = lVar4 + 1) {
      generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
      ::assignCoeff(kernel,lVar4,col_00);
    }
    lVar4 = (lVar1 - lVar3 & 0xfffffffffffffffcU) + lVar3;
    for (lVar5 = lVar3; lVar5 < lVar4; lVar5 = lVar5 + 4) {
      generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,-1,-1,0,-1,-1>>,Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,-1,false>>,Eigen::internal::assign_op<float,float>,0>
      ::assignPacket<16,0,float__vector(4)>
                ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,false>>,Eigen::internal::assign_op<float,float>,0>
                  *)kernel,lVar5,col_00);
    }
    for (; lVar4 < lVar1; lVar4 = lVar4 + 1) {
      generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::assign_op<float,_float>,_0>
      ::assignCoeff(kernel,lVar4,col_00);
    }
    lVar3 = (long)(lVar3 + (ulong)(-(int)lVar1 & 3)) % 4;
    if (lVar1 < lVar3) {
      lVar3 = lVar1;
    }
  }
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    typedef typename Kernel::Scalar Scalar;
    typedef typename Kernel::PacketType PacketType;
    enum {
      packetSize = unpacket_traits<PacketType>::size,
      requestedAlignment = int(Kernel::AssignmentTraits::InnerRequiredAlignment),
      alignable = packet_traits<Scalar>::AlignedOnScalar || int(Kernel::AssignmentTraits::DstAlignment)>=sizeof(Scalar),
      dstIsAligned = int(Kernel::AssignmentTraits::DstAlignment)>=int(requestedAlignment),
      dstAlignment = alignable ? int(requestedAlignment)
                               : int(Kernel::AssignmentTraits::DstAlignment)
    };
    const Scalar *dst_ptr = kernel.dstDataPtr();
    if((!bool(dstIsAligned)) && (UIntPtr(dst_ptr) % sizeof(Scalar))>0)
    {
      // the pointer is not aligned-on scalar, so alignment is not possible
      return dense_assignment_loop<Kernel,DefaultTraversal,NoUnrolling>::run(kernel);
    }
    const Index packetAlignedMask = packetSize - 1;
    const Index innerSize = kernel.innerSize();
    const Index outerSize = kernel.outerSize();
    const Index alignedStep = alignable ? (packetSize - kernel.outerStride() % packetSize) & packetAlignedMask : 0;
    Index alignedStart = ((!alignable) || bool(dstIsAligned)) ? 0 : internal::first_aligned<requestedAlignment>(dst_ptr, innerSize);

    for(Index outer = 0; outer < outerSize; ++outer)
    {
      const Index alignedEnd = alignedStart + ((innerSize-alignedStart) & ~packetAlignedMask);
      // do the non-vectorizable part of the assignment
      for(Index inner = 0; inner<alignedStart ; ++inner)
        kernel.assignCoeffByOuterInner(outer, inner);

      // do the vectorizable part of the assignment
      for(Index inner = alignedStart; inner<alignedEnd; inner+=packetSize)
        kernel.template assignPacketByOuterInner<dstAlignment, Unaligned, PacketType>(outer, inner);

      // do the non-vectorizable part of the assignment
      for(Index inner = alignedEnd; inner<innerSize ; ++inner)
        kernel.assignCoeffByOuterInner(outer, inner);

      alignedStart = numext::mini((alignedStart+alignedStep)%packetSize, innerSize);
    }
  }